

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

uint __thiscall CodeGenGenericContext::MemFind(CodeGenGenericContext *this,x86Argument *address)

{
  uint in_EAX;
  uint uVar1;
  long lVar2;
  bool bVar3;
  
  uVar1 = 1;
  lVar2 = 0;
  while( true ) {
    bVar3 = true;
    if ((((*(int *)((long)&this->memCache[0].value.type + lVar2) != 0) &&
         (*(int *)((long)&this->memCache[0].address.type + lVar2) != 0)) &&
        (*(x86Reg *)((long)&this->memCache[0].address.field_1 + lVar2) == (address->field_1).reg))
       && (((*(int *)((long)&this->memCache[0].address.ptrNum + lVar2) == address->ptrNum &&
            (*(x86Reg *)((long)&this->memCache[0].address.ptrBase + lVar2) == address->ptrBase)) &&
           (bVar3 = *(x86Reg *)((long)&this->memCache[0].address.ptrIndex + lVar2) !=
                    address->ptrIndex, !bVar3)))) {
      in_EAX = uVar1;
    }
    if (!bVar3) break;
    uVar1 = uVar1 + 1;
    lVar2 = lVar2 + 0x48;
    if (lVar2 == 0x480) {
      return 0;
    }
  }
  return in_EAX;
}

Assistant:

unsigned CodeGenGenericContext::MemFind(const x86Argument &address)
{
	for(unsigned i = 0; i < memoryStateSize; i++)
	{
		MemCache &entry = memCache[i];

		if(entry.value.type != x86Argument::argNone && entry.address.type != x86Argument::argNone && entry.address.ptrSize == address.ptrSize && entry.address.ptrNum == address.ptrNum && entry.address.ptrBase == address.ptrBase && entry.address.ptrIndex == address.ptrIndex)
			return i + 1;
	}

	return 0;
}